

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample.cpp
# Opt level: O0

vector<Point_d,_std::allocator<Point_d>_> * __thiscall
Sampler::sample_rand_points
          (vector<Point_d,_std::allocator<Point_d>_> *__return_storage_ptr__,Sampler *this)

{
  int iVar1;
  size_type sVar2;
  reference pvVar3;
  reference this_00;
  int local_7c;
  int n;
  int i;
  Point_d pix;
  pair<int,_int> local_48;
  int local_40;
  int local_3c;
  int y;
  int x;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> not_sampled_yet;
  Sampler *this_local;
  vector<Point_d,_std::allocator<Point_d>_> *output_pattern;
  
  std::operator<<((ostream *)&std::cout,"sampling random points\n");
  not_sampled_yet.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  std::vector<Point_d,_std::allocator<Point_d>_>::vector(__return_storage_ptr__);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&y);
  for (local_3c = 0; local_3c < this->_X; local_3c = local_3c + 1) {
    for (local_40 = 0; local_40 < this->_Y; local_40 = local_40 + 1) {
      std::pair<int,_int>::pair<int_&,_int_&,_true>(&local_48,&local_3c,&local_40);
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
                ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&y,&local_48)
      ;
    }
  }
  Point_d::Point_d((Point_d *)&n,999999.0,99999.0,99999.0,9999999);
  for (local_7c = 0; local_7c < this->_Amount; local_7c = local_7c + 1) {
    iVar1 = rand();
    sVar2 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size
                      ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&y);
    iVar1 = (int)((ulong)(long)iVar1 % sVar2);
    pvVar3 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                       ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&y,
                        (long)iVar1);
    _n = (double)pvVar3->first;
    pvVar3 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                       ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&y,
                        (long)iVar1);
    pix.x = (double)pvVar3->second;
    pix.dis._0_4_ = local_7c;
    pvVar3 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::back
                       ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&y);
    this_00 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                        ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&y,
                         (long)iVar1);
    std::pair<int,_int>::operator=(this_00,pvVar3);
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::pop_back
              ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&y);
    std::vector<Point_d,_std::allocator<Point_d>_>::push_back
              (__return_storage_ptr__,(value_type *)&n);
  }
  not_sampled_yet.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&y);
  if ((not_sampled_yet.
       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
    std::vector<Point_d,_std::allocator<Point_d>_>::~vector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Point_d> sample_rand_points(){
      std::cout<<"sampling random points\n";
      std::vector<Point_d> output_pattern;

      //PREPARE:
      std::vector<std::pair<int, int> > not_sampled_yet;
      for(int x=0; x<_X; x++)
      {
        for(int y=0; y<_Y; y++)
        {
          not_sampled_yet.push_back(std::pair<int,int>(x,y));
        }
      }
      //SAMPLING
      Point_d pix;
      for (int i=0; i<_Amount; i++)
      {
        //std::cout<<i<<"\n";
        int n= rand()% not_sampled_yet.size();
        pix.x= (double)not_sampled_yet[n].first;
        pix.y= (double)not_sampled_yet[n].second;
        pix.id = i;
        not_sampled_yet[n]=not_sampled_yet.back();
        not_sampled_yet.pop_back();
        output_pattern.push_back(pix);
      }
      return output_pattern;

    }